

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_data_dictionary_find_definition_for_product
              (coda_product *product,coda_product_definition **definition)

{
  int iVar1;
  coda_detection_node *node;
  undefined1 local_330 [8];
  coda_cursor cursor;
  coda_product_definition **definition_local;
  coda_product *product_local;
  
  cursor.stack[0x1f].bit_offset = (int64_t)definition;
  iVar1 = coda_cursor_set_product((coda_cursor *)local_330,product);
  if (iVar1 == 0) {
    node = coda_data_dictionary_get_detection_tree(product->format);
    product_local._4_4_ =
         coda_evaluate_detection_node
                   (node,(coda_cursor *)local_330,
                    (coda_product_definition **)cursor.stack[0x1f].bit_offset);
  }
  else {
    product_local._4_4_ = -1;
  }
  return product_local._4_4_;
}

Assistant:

int coda_data_dictionary_find_definition_for_product(coda_product *product, coda_product_definition **definition)
{
    coda_cursor cursor;

    if (coda_cursor_set_product(&cursor, product) != 0)
    {
        return -1;
    }

    return coda_evaluate_detection_node(coda_data_dictionary_get_detection_tree(product->format), &cursor, definition);
}